

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O3

bool __thiscall bdSpace::flagpeer(bdSpace *this,bdId *id,uint32_t flags,uint32_t ex_flags)

{
  uint *puVar1;
  _List_node_base **pp_Var2;
  pointer pbVar3;
  int iVar4;
  pointer pbVar5;
  bdMetric met;
  undefined1 local_44 [20];
  
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,&this->mOwnId,&id->id,local_44);
  iVar4 = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,local_44);
  pbVar3 = (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
           super__Vector_impl_data._M_start + iVar4;
  for (pbVar5 = *(pointer *)&(pbVar3->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>;
      pbVar5 != pbVar3;
      pbVar5 = *(pointer *)&(pbVar5->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>) {
    iVar4 = (*this->mFns->_vptr_bdDhtFunctions[7])
                      (this->mFns,id,
                       &(pbVar5->entries).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
                        _M_node._M_size);
    if ((char)iVar4 != '\0') {
      puVar1 = (uint *)((long)&pbVar5[2].entries.super__List_base<bdPeer,_std::allocator<bdPeer>_>.
                               _M_impl._M_node.super__List_node_base._M_next + 4);
      *puVar1 = *puVar1 | flags;
      pp_Var2 = &pbVar5[3].entries.super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node
                 .super__List_node_base._M_prev;
      *(uint *)pp_Var2 = *(uint *)pp_Var2 | ex_flags;
    }
  }
  return true;
}

Assistant:

bool    bdSpace::flagpeer(const bdId *id, uint32_t flags, uint32_t ex_flags) {
#ifdef DEBUG_BD_SPACE
	fprintf(stderr, "bdSpace::flagpeer()\n");
#endif

	/* calculate metric */
	bdMetric met;
	mFns->bdDistance(&(mOwnId), &(id->id), &met);
	int bucket = mFns->bdBucketDistance(&met);


	/* select correct bucket */
	bdBucket &buck =  buckets[bucket];

	/* loop through ids, to find it */
	std::list<bdPeer>::iterator it;
	for (it = buck.entries.begin(); it != buck.entries.end(); it++) {
                /* similar id check */
		if (mFns->bdSimilarId(id, &(it->mPeerId))) {
#ifdef DEBUG_BD_SPACE
			fprintf(stderr, "peer:");
			mFns->bdPrintId(std::cerr, id);	
			fprintf(stderr, " bucket: %d", bucket);
			fprintf(stderr, "\n");
			fprintf(stderr, "Original Flags: %x Extra: %x\n", 
				it->mPeerFlags, it->mExtraFlags);
#endif
			it->mPeerFlags |= flags;
			it->mExtraFlags |= ex_flags;

#ifdef DEBUG_BD_SPACE
			fprintf(stderr, "Updated Flags: %x Extra: %x\n",
				it->mPeerFlags, it->mExtraFlags);
#endif
		}
	}
	return true;
}